

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O2

Point __thiscall ellipses::estimate_target_center(ellipses *this,Mat *pretreat,bool debug)

{
  pointer pvVar1;
  undefined7 in_register_00000011;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *__range1;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *v;
  pointer pvVar2;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> result;
  undefined1 local_58 [24];
  undefined4 local_40 [2];
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  if ((int)CONCAT71(in_register_00000011,debug) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&contours,"gray",(allocator<char> *)&result);
    cv::namedWindow((string *)&contours,0);
    std::__cxx11::string::~string((string *)&contours);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&contours,"gray",(allocator<char> *)local_40);
    result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(result.
                           super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x1010000);
    result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pretreat;
    cv::imshow((string *)&contours,(_InputArray *)&result);
    std::__cxx11::string::~string((string *)&contours);
    cv::waitKey(0);
  }
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(result.
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x1010000);
  local_30 = 0;
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40[0] = 0x8204000c;
  local_28 = 0;
  result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pretreat;
  local_38 = (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&contours;
  cv::findContours(&result,local_40,1,2);
  pvVar1 = contours.
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pvVar2 = contours.
                super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar2 != pvVar1; pvVar2 = pvVar2 + 1) {
    if ((ulong)((long)result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start) <
        (ulong)((long)(pvVar2->
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar2->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)) {
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::_M_move_assign
                (&result,pvVar2);
    }
  }
  local_30 = 0;
  local_40[0] = 0x8103000c;
  local_38 = &result;
  cv::fitEllipse((_InputArray *)local_58);
  *(int *)this = (int)ROUND((float)local_58._0_4_);
  *(int *)(this + 4) = (int)ROUND((float)local_58._4_4_);
  std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
            (&result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&contours);
  return (Point)this;
}

Assistant:

cv::Point estimate_target_center(const cv::Mat& pretreat, bool debug)
{
    if(debug)
    {
        cv::namedWindow("gray", cv::WINDOW_NORMAL);
        cv::imshow("gray", pretreat);
        cv::waitKey(0);
    }

    std::vector<std::vector<cv::Point>> contours;
    findContours(pretreat, contours, cv::RETR_LIST, cv::CHAIN_APPROX_SIMPLE);

    std::vector<cv::Point> result;

    for(auto& v : contours)
    {
        if(v.size() > result.size())
        {
            result = std::move(v);
        }
    }

    return cv::fitEllipse(result).center;
}